

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O3

bool doctest::anon_unknown_15::parseOption
               (int argc,char **argv,char *pattern,String *value,String *defaultVal)

{
  bool bVar1;
  String *value_00;
  
  if (value == (String *)0x0) {
    value_00 = (String *)0x0;
  }
  else {
    String::operator=(value,defaultVal);
    value_00 = value;
  }
  bVar1 = parseOptionImpl(argc,argv,pattern + 3,value_00);
  if (bVar1) {
    return true;
  }
  bVar1 = parseOptionImpl(argc,argv,pattern,value);
  return bVar1;
}

Assistant:

bool parseOption(int argc, const char* const* argv, const char* pattern, String* value = nullptr,
                     const String& defaultVal = String()) {
        if(value)
            *value = defaultVal;
#ifndef DOCTEST_CONFIG_NO_UNPREFIXED_OPTIONS
        // offset (normally 3 for "dt-") to skip prefix
        if(parseOptionImpl(argc, argv, pattern + strlen(DOCTEST_CONFIG_OPTIONS_PREFIX), value))
            return true;
#endif // DOCTEST_CONFIG_NO_UNPREFIXED_OPTIONS
        return parseOptionImpl(argc, argv, pattern, value);
    }